

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cc
# Opt level: O2

bool gutil::skip(istream *in,char *expected)

{
  bool bVar1;
  string s;
  
  if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    std::operator>>(in,(string *)&s);
    bVar1 = std::operator==(&s,expected);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&s);
      return true;
    }
    std::ios::setstate((int)in + (int)*(undefined8 *)(*(long *)in + -0x18));
    std::__cxx11::string::~string((string *)&s);
  }
  return false;
}

Assistant:

bool gutil::skip(std::istream &in, const char *expected)
{
  if (in.good())
  {
    std::string s;
    in >> s;

    if (s == expected)
    {
      return true;
    }

#ifndef NDEBUG
    std::cerr << "gutil::skip() expected '" << expected << "' but got '" << s << "'" << std::endl;
#endif

    in.setstate(std::ios_base::failbit);
  }

  return false;
}